

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

void google::anon_unknown_0::DumpStackFrameInfo(char *prefix,void *pc)

{
  char *__src;
  bool bVar1;
  size_t __len;
  size_t __n;
  char *pcVar2;
  MinimalFormatter formatter;
  char buf [1024];
  char symbolized [1024];
  
  bVar1 = Symbolize((void *)((long)pc + -1),symbolized,0x400);
  formatter.buffer_ = buf;
  formatter.end_ = symbolized;
  formatter.cursor_ = formatter.buffer_;
  MinimalFormatter::AppendString(&formatter,prefix);
  MinimalFormatter::AppendString(&formatter,"@ ");
  __src = formatter.cursor_;
  MinimalFormatter::AppendString(&formatter,"0x");
  MinimalFormatter::AppendUint64(&formatter,(uint64)pc,0x10);
  pcVar2 = __src + 0x12;
  if (formatter.cursor_ < pcVar2) {
    __n = (long)pcVar2 - (long)formatter.cursor_;
    if ((long)formatter.cursor_ - (long)__src != 0) {
      memmove(__src + __n,__src,(long)formatter.cursor_ - (long)__src);
    }
    memset(__src,0x20,__n);
    formatter.cursor_ = pcVar2;
  }
  pcVar2 = "(unknown)";
  if (bVar1) {
    pcVar2 = symbolized;
  }
  MinimalFormatter::AppendString(&formatter," ");
  MinimalFormatter::AppendString(&formatter,pcVar2);
  MinimalFormatter::AppendString(&formatter,"\n");
  (*(code *)(anonymous_namespace)::g_failure_writer)
            (buf,(long)formatter.cursor_ - (long)formatter.buffer_);
  return;
}

Assistant:

void DumpStackFrameInfo(const char* prefix, void* pc) {
  // Get the symbol name.
  const char* symbol = "(unknown)";
  char symbolized[1024];  // Big enough for a sane symbol.
  // Symbolizes the previous address of pc because pc may be in the
  // next function.
  if (Symbolize(reinterpret_cast<char*>(pc) - 1, symbolized,
                sizeof(symbolized))) {
    symbol = symbolized;
  }

  char buf[1024];  // Big enough for stack frame info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString(prefix);
  formatter.AppendString("@ ");
  const int width = 2 * sizeof(void*) + 2;  // + 2  for "0x".
  formatter.AppendHexWithPadding(reinterpret_cast<uintptr_t>(pc), width);
  formatter.AppendString(" ");
  formatter.AppendString(symbol);
  formatter.AppendString("\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}